

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

ParamGenerator<const_libaom_test::AV1CodecFactory_*> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  ParamGenerator<const_libaom_test::AV1CodecFactory_*> PVar2;
  initializer_list<const_libaom_test::AV1CodecFactory_*> __l;
  allocator_type local_31;
  vector<const_libaom_test::AV1CodecFactory_*,_std::allocator<const_libaom_test::AV1CodecFactory_*>_>
  local_30;
  AV1CodecFactory *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_18 = (AV1CodecFactory *)*in_RSI;
  __l._M_len = 1;
  __l._M_array = &local_18;
  std::
  vector<const_libaom_test::AV1CodecFactory_*,_std::allocator<const_libaom_test::AV1CodecFactory_*>_>
  ::vector(&local_30,__l,&local_31);
  PVar2 = ValuesIn<__gnu_cxx::__normal_iterator<libaom_test::AV1CodecFactory_const*const*,std::vector<libaom_test::AV1CodecFactory_const*,std::allocator<libaom_test::AV1CodecFactory_const*>>>>
                    ((testing *)this,
                     (__normal_iterator<const_libaom_test::AV1CodecFactory_*const_*,_std::vector<const_libaom_test::AV1CodecFactory_*,_std::allocator<const_libaom_test::AV1CodecFactory_*>_>_>
                      )local_30.
                       super__Vector_base<const_libaom_test::AV1CodecFactory_*,_std::allocator<const_libaom_test::AV1CodecFactory_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<const_libaom_test::AV1CodecFactory_*const_*,_std::vector<const_libaom_test::AV1CodecFactory_*,_std::allocator<const_libaom_test::AV1CodecFactory_*>_>_>
                      )local_30.
                       super__Vector_base<const_libaom_test::AV1CodecFactory_*,_std::allocator<const_libaom_test::AV1CodecFactory_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  _Var1._M_pi = PVar2.impl_.
                super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_libaom_test::AV1CodecFactory_*>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if (local_30.
      super__Vector_base<const_libaom_test::AV1CodecFactory_*,_std::allocator<const_libaom_test::AV1CodecFactory_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (AV1CodecFactory **)0x0) {
    operator_delete(local_30.
                    super__Vector_base<const_libaom_test::AV1CodecFactory_*,_std::allocator<const_libaom_test::AV1CodecFactory_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    _Var1._M_pi = extraout_RDX;
  }
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_libaom_test::AV1CodecFactory_*>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_libaom_test::AV1CodecFactory_*>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<const_libaom_test::AV1CodecFactory_*>)
         PVar2.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_libaom_test::AV1CodecFactory_*>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }